

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JobResults.cpp
# Opt level: O1

void xmrig::JobResults::stop(void)

{
  long lVar1;
  void *pvVar2;
  int iVar3;
  
  pvVar2 = xmrig::handler;
  if (xmrig::handler != (void *)0x0) {
    lVar1 = *(long *)((long)xmrig::handler + 0x50);
    if (lVar1 != 0) {
      iVar3 = uv_is_closing(lVar1);
      if (iVar3 == 0) {
        uv_close(lVar1,Handle::deleteLater<uv_async_s_*>::anon_class_1_0_00000001::__invoke);
      }
    }
    std::__cxx11::_List_base<xmrig::JobBundle,_std::allocator<xmrig::JobBundle>_>::_M_clear
              ((_List_base<xmrig::JobBundle,_std::allocator<xmrig::JobBundle>_> *)
               ((long)pvVar2 + 0x58));
    std::__cxx11::_List_base<xmrig::JobResult,_std::allocator<xmrig::JobResult>_>::_M_clear
              ((_List_base<xmrig::JobResult,_std::allocator<xmrig::JobResult>_> *)
               ((long)pvVar2 + 0x10));
    operator_delete(pvVar2);
  }
  xmrig::handler = (void *)0x0;
  return;
}

Assistant:

void xmrig::JobResults::stop()
{
    assert(handler != nullptr);

    delete handler;

    handler = nullptr;
}